

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall
Descriptor_ParseElements_addr_Test::~Descriptor_ParseElements_addr_Test
          (Descriptor_ParseElements_addr_Test *this)

{
  Descriptor_ParseElements_addr_Test *this_local;
  
  ~Descriptor_ParseElements_addr_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Descriptor, ParseElements_addr) {
  std::string descriptor = "addr(ert1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqsflana4)";
  Descriptor desc;
  Script locking_script;
  std::string desc_str = "";

  EXPECT_NO_THROW(desc = Descriptor::ParseElements(descriptor));
  EXPECT_NO_THROW(locking_script = desc.GetLockingScript());
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_STREQ(desc_str.c_str(), descriptor.c_str());
  EXPECT_STREQ(locking_script.ToString().c_str(),
      "0 c62982ba62f90e2929b8830cc3c6dc0c38fe7766d178f217f0dbbd0bf2705201");
}